

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp0_helper.c
# Opt level: O0

void helper_mttdsp_mipsel(CPUMIPSState_conflict2 *env,target_ulong_conflict arg1)

{
  CPUMIPSState_conflict2 *pCVar1;
  CPUMIPSState_conflict2 *other;
  int other_tc;
  target_ulong_conflict arg1_local;
  CPUMIPSState_conflict2 *env_local;
  
  other._0_4_ = env->CP0_VPEControl & 0xff;
  other._4_4_ = arg1;
  _other_tc = env;
  pCVar1 = mips_cpu_map_tc(env,(int *)&other);
  if ((uint)other == pCVar1->current_tc) {
    (pCVar1->active_tc).DSPControl = other._4_4_;
  }
  else {
    pCVar1->tcs[(int)(uint)other].DSPControl = other._4_4_;
  }
  return;
}

Assistant:

void helper_mttdsp(CPUMIPSState *env, target_ulong arg1)
{
    int other_tc = env->CP0_VPEControl & (0xff << CP0VPECo_TargTC);
    CPUMIPSState *other = mips_cpu_map_tc(env, &other_tc);

    if (other_tc == other->current_tc) {
        other->active_tc.DSPControl = arg1;
    } else {
        other->tcs[other_tc].DSPControl = arg1;
    }
}